

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

size_t __thiscall wabt::anon_unknown_0::CWriter::BeginTry(CWriter *this,TryExpr *tryexpr)

{
  FuncSignature *sig;
  pointer *ppTVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer __first;
  pointer pLVar4;
  __type _Var5;
  ulong uVar6;
  ulong uVar7;
  pointer __result;
  pointer pTVar8;
  pointer pTVar9;
  long lVar10;
  char (*args) [16];
  _Tp_alloc_type *__alloc;
  Newline *u;
  Newline *u_00;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_01;
  OpenBrace *u_02;
  string *t;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  size_t mark;
  string_view name;
  string tlabel;
  
  Write();
  name._M_str = (tryexpr->block).label._M_dataplus._M_p;
  name._M_len = (tryexpr->block).label._M_string_length;
  (anonymous_namespace)::CWriter::DefineLabelName_abi_cxx11_(&tlabel,(CWriter *)this,name);
  WriteData(this,"WASM_RT_UNWIND_TARGET *",0x17);
  WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
  WriteData(this,"_outer_target = wasm_rt_get_unwind_target();",0x2c);
  Write(this);
  WriteData(this,"WASM_RT_UNWIND_TARGET ",0x16);
  WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [16])"_unwind_target;",u);
  WriteData(this,"if (!wasm_rt_try(",0x11);
  WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
  WriteData(this,"_unwind_target)) ",0x11);
  Write(this);
  sig = &(tryexpr->block).decl.sig;
  DropTypes(this,(ulong)((long)*(pointer *)
                                ((long)&(tryexpr->block).decl.sig.param_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data + 8) -
                        (long)(tryexpr->block).decl.sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  pTVar2 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  PushLabel(this,Try,&(tryexpr->block).label,sig,(bool)in_R8B);
  PushTypes(this,&sig->param_types);
  WriteData(this,"wasm_rt_set_unwind_target(&",0x1b);
  WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [17])"_unwind_target);",u_00);
  __first = (this->try_catch_stack_).
            super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar9 = (this->try_catch_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  args = (char (*) [16])((long)pTVar9 - (long)__first);
  uVar6 = (long)args / 0x30;
  if (pTVar9 == (this->try_catch_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    if (args == (char (*) [16])0x7fffffffffffffe0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar7 = 1;
    if (pTVar9 != __first) {
      uVar7 = uVar6;
    }
    uVar11 = uVar7 + uVar6;
    __alloc = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
    if (0x2aaaaaaaaaaaaa9 < uVar11) {
      uVar11 = 0x2aaaaaaaaaaaaaa;
    }
    if (CARRY8(uVar7,uVar6)) {
      uVar11 = 0x2aaaaaaaaaaaaaa;
    }
    if (uVar11 == 0) {
      __result = (pointer)0x0;
    }
    else {
      __result = (pointer)operator_new(uVar11 * 0x30);
    }
    std::__cxx11::string::string((string *)(__result + uVar6),(string *)&tlabel);
    __result[uVar6].try_catch_stack_size = uVar6;
    __result[uVar6].used = false;
    pTVar8 = std::
             vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
             ::_S_relocate(__first,pTVar9,__result,__alloc);
    pTVar9 = std::
             vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
             ::_S_relocate(pTVar9,pTVar9,pTVar8 + 1,__alloc);
    lVar10 = (long)(this->try_catch_stack_).
                   super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    args = (char (*) [16])0x30;
    std::
    _Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ::_M_deallocate((_Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                     *)__first,(pointer)(lVar10 / 0x30),lVar10 % 0x30);
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar9;
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar11;
  }
  else {
    std::__cxx11::string::string((string *)pTVar9,(string *)&tlabel);
    pTVar9->try_catch_stack_size = uVar6;
    pTVar9->used = false;
    ppTVar1 = &(this->try_catch_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  mark = (long)pTVar2 - (long)pTVar3 >> 3;
  Write(this,&(tryexpr->block).exprs);
  ResetTypeStack(this,mark);
  t = &tlabel;
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [27])t,u_01,args,
             (Newline *)CONCAT71(in_register_00000081,in_R8B));
  Write(this);
  (anonymous_namespace)::CWriter::Write<char_const(&)[7],wabt::(anonymous_namespace)::OpenBrace>
            ((CWriter *)this,(char (*) [7])t,u_02);
  _Var5 = std::operator==((this->label_stack_).
                          super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].name,
                          &(tryexpr->block).label);
  if (_Var5) {
    pLVar4 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar4[-1].label_type == Try) {
      pLVar4[-1].label_type = Catch;
      if ((this->try_catch_stack_).
          super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].used == true) {
        WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
        WriteData(this,"_catch:;",8);
        Write(this);
      }
      std::__cxx11::string::_M_dispose();
      return mark;
    }
    __assert_fail("label_stack_.back().label_type == LabelType::Try",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x9bb,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const TryExpr &)");
  }
  __assert_fail("label_stack_.back().name == tryexpr.block.label",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x9ba,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const TryExpr &)");
}

Assistant:

size_t CWriter::BeginTry(const TryExpr& tryexpr) {
  Write(OpenBrace()); /* beginning of try-catch */
  const std::string tlabel = DefineLabelName(tryexpr.block.label);
  Write("WASM_RT_UNWIND_TARGET *", tlabel,
        "_outer_target = wasm_rt_get_unwind_target();", Newline());
  Write("WASM_RT_UNWIND_TARGET ", tlabel, "_unwind_target;", Newline());
  Write("if (!wasm_rt_try(", tlabel, "_unwind_target)) ");
  Write(OpenBrace()); /* beginning of try block */
  DropTypes(tryexpr.block.decl.GetNumParams());
  const size_t mark = MarkTypeStack();
  PushLabel(LabelType::Try, tryexpr.block.label, tryexpr.block.decl.sig);
  PushTypes(tryexpr.block.decl.sig.param_types);
  Write("wasm_rt_set_unwind_target(&", tlabel, "_unwind_target);", Newline());
  PushTryCatch(tlabel);
  Write(tryexpr.block.exprs);
  ResetTypeStack(mark);
  Write("wasm_rt_set_unwind_target(", tlabel, "_outer_target);", Newline());
  Write(CloseBrace());          /* end of try block */
  Write(" else ", OpenBrace()); /* beginning of catch blocks or delegate */
  assert(label_stack_.back().name == tryexpr.block.label);
  assert(label_stack_.back().label_type == LabelType::Try);
  label_stack_.back().label_type = LabelType::Catch;
  if (try_catch_stack_.back().used) {
    Write(tlabel, "_catch:;", Newline());
  }

  return mark;
}